

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_wrapper.hpp
# Opt level: O2

box<float,_784UL> * __thiscall
pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>::
compute_bounding_box
          (box<float,_784UL> *__return_storage_ptr__,
          space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_> *this)

{
  size_type i;
  ulong uVar1;
  long lVar2;
  
  box_base<pico_tree::internal::box<float,_784UL>_>::fill_inverse_max
            ((box_base<pico_tree::internal::box<float,_784UL>_> *)__return_storage_ptr__);
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < **(ulong **)this; uVar1 = uVar1 + 1) {
    box_base<pico_tree::internal::box<float,_784UL>_>::fit
              ((box_base<pico_tree::internal::box<float,_784UL>_> *)__return_storage_ptr__,
               (scalar_type *)((*(ulong **)this)[1] + lVar2));
    lVar2 = lVar2 + 0xc40;
  }
  return __return_storage_ptr__;
}

Assistant:

inline box<scalar_type, dim> compute_bounding_box() const {
    auto bbox = box<scalar_type, dim>::make_inverse_max(sdim());
    for (size_type i = 0; i < size(); ++i) {
      bbox.fit(operator[](i));
    }
    return bbox;
  }